

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void stat4Destructor(void *pOld)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  sqlite3 *db;
  long lVar4;
  long lVar5;
  
  iVar3 = *(int *)((long)pOld + 8);
  if (0 < iVar3) {
    lVar4 = 0x20;
    lVar5 = 0;
    do {
      lVar1 = *(long *)((long)pOld + 0x50);
      if (*(int *)(lVar1 + lVar4) != 0) {
        pvVar2 = *(void **)(lVar1 + -8 + lVar4);
        if (pvVar2 != (void *)0x0) {
          sqlite3DbFreeNN(*(sqlite3 **)((long)pOld + 0x70),pvVar2);
          iVar3 = *(int *)((long)pOld + 8);
        }
        *(undefined4 *)(lVar1 + lVar4) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x30;
    } while (lVar5 < iVar3);
  }
  iVar3 = *(int *)((long)pOld + 0x10);
  if (0 < iVar3) {
    lVar4 = 0x20;
    lVar5 = 0;
    do {
      lVar1 = *(long *)((long)pOld + 0x68);
      if (*(int *)(lVar1 + lVar4) != 0) {
        pvVar2 = *(void **)(lVar1 + -8 + lVar4);
        if (pvVar2 != (void *)0x0) {
          sqlite3DbFreeNN(*(sqlite3 **)((long)pOld + 0x70),pvVar2);
          iVar3 = *(int *)((long)pOld + 0x10);
        }
        *(undefined4 *)(lVar1 + lVar4) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x30;
    } while (lVar5 < iVar3);
  }
  db = *(sqlite3 **)((long)pOld + 0x70);
  if (*(int *)((long)pOld + 0x38) != 0) {
    if (*(void **)((long)pOld + 0x30) != (void *)0x0) {
      sqlite3DbFreeNN(db,*(void **)((long)pOld + 0x30));
      db = *(sqlite3 **)((long)pOld + 0x70);
    }
    *(undefined4 *)((long)pOld + 0x38) = 0;
  }
  sqlite3DbFreeNN(db,pOld);
  return;
}

Assistant:

static void stat4Destructor(void *pOld){
  Stat4Accum *p = (Stat4Accum*)pOld;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int i;
  for(i=0; i<p->nCol; i++) sampleClear(p->db, p->aBest+i);
  for(i=0; i<p->mxSample; i++) sampleClear(p->db, p->a+i);
  sampleClear(p->db, &p->current);
#endif
  sqlite3DbFree(p->db, p);
}